

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSGetNumMassIters(void *arkode_mem,long *nmiters)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSGetNumMassIters",&local_10,&local_18);
  if (iVar1 == 0) {
    *nmiters = local_18->nli;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSGetNumMassIters(void *arkode_mem, long int *nmiters)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure; set output value and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSGetNumMassIters",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);
  *nmiters = arkls_mem->nli;
  return(ARKLS_SUCCESS);
}